

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O2

void __thiscall
reader_authority_suite::test_ipv6_line_6a_v6::test_method(test_ipv6_line_6a_v6 *this)

{
  undefined4 local_f8;
  value local_f4;
  view_type local_f0;
  undefined8 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  authority reader;
  char input [23];
  
  local_f0.ptr_ = input;
  builtin_strncpy(input,"[1111::FFFF:1234:5678]",0x17);
  local_f0.len_ = strlen(local_f0.ptr_);
  trial::url::reader::basic_authority<char>::basic_authority(&reader,&local_f0);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x119);
  local_f0.len_ = local_f0.len_ & 0xffffffffffffff00;
  local_f0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_98 = "";
  local_f4 = reader.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_f8 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_f0,&local_a0,0x119,2,2,&local_f4,"reader.subcode()",&local_f8,
             "url::token::subcode::authority_host_ipv6");
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x11a);
  local_f0.len_ = local_f0.len_ & 0xffffffffffffff00;
  local_f0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_c8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[21]>
            (&local_f0,&local_d0,0x11a,2,2,
             &reader.super_base<char,_trial::url::reader::basic_authority>.current_view,
             "reader.literal()","1111::FFFF:1234:5678","\"1111::FFFF:1234:5678\"");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv6_line_6a_v6)
{
    const char input[] = "[1111::FFFF:1234:5678]";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv6);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1111::FFFF:1234:5678");
}